

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleParser.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  string_view json_00;
  ostream *poVar1;
  void *this;
  Slice separator;
  exception *ex;
  shared_ptr<arangodb::velocypack::Builder> b;
  bad_alloc *anon_var_0;
  Exception *ex_1;
  ValueLength nr;
  Parser parser;
  string json;
  Builder *in_stack_fffffffffffffdd8;
  HexDump *in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffdef;
  Parser *in_stack_fffffffffffffdf0;
  Parser *in_stack_fffffffffffffdf8;
  Parser *in_stack_fffffffffffffe00;
  string *header;
  allocator<char> *in_stack_fffffffffffffe10;
  HexDump *in_stack_fffffffffffffe18;
  Slice in_stack_fffffffffffffe20;
  allocator<char> local_169 [40];
  string local_141;
  uint8_t *local_120;
  __sv_type local_a0;
  ulong local_90;
  allocator<char> local_31;
  string local_30 [44];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20._start,(char *)in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator(&local_31);
  poVar1 = std::operator<<((ostream *)&std::cout,"Parsing JSON string \'");
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"\'");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  arangodb::velocypack::Parser::Parser(in_stack_fffffffffffffe00);
  local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffde0);
  json_00._M_str = (char *)in_stack_fffffffffffffe00;
  json_00._M_len = (size_t)in_stack_fffffffffffffdf8;
  local_90 = arangodb::velocypack::Parser::parse
                       (in_stack_fffffffffffffdf0,json_00,(bool)in_stack_fffffffffffffdef);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of values: ");
  this = (void *)std::ostream::operator<<(poVar1,local_90);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  arangodb::velocypack::Parser::steal(in_stack_fffffffffffffdf8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Resulting VPack:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x103884);
  separator = arangodb::velocypack::Builder::slice(in_stack_fffffffffffffdd8);
  header = &local_141;
  local_120 = separator._start;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20._start,(char *)in_stack_fffffffffffffe18,
             (allocator<char> *)poVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20._start,(char *)in_stack_fffffffffffffe18,
             (allocator<char> *)poVar1);
  arangodb::velocypack::HexDump::HexDump
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,(int)((ulong)poVar1 >> 0x20),
             (string *)separator._start,header);
  poVar1 = arangodb::velocypack::operator<<
                     ((ostream *)in_stack_fffffffffffffe20._start,in_stack_fffffffffffffe18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  arangodb::velocypack::HexDump::~HexDump(in_stack_fffffffffffffde0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  std::allocator<char>::~allocator(local_169);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::shared_ptr<arangodb::velocypack::Builder>::~shared_ptr
            ((shared_ptr<arangodb::velocypack::Builder> *)0x1039a2);
  arangodb::velocypack::Parser::~Parser((Parser *)0x1039af);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  return local_4;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // this is the JSON string we are going to parse
  std::string const json = "{\"a\":12}";
  std::cout << "Parsing JSON string '" << json << "'" << std::endl;

  Parser parser;
  try {
    ValueLength nr = parser.parse(json);
    std::cout << "Number of values: " << nr << std::endl;
  } catch (std::bad_alloc const&) {
    std::cout << "Out of memory!" << std::endl;
    throw;
  } catch (Exception const& ex) {
    std::cout << "Parse error: " << ex.what() << std::endl;
    std::cout << "Position of error: " << parser.errorPos() << std::endl;
    throw;
  }

  // get a pointer to the start of the data
  std::shared_ptr<Builder> b = parser.steal();

  // now dump the resulting VPack value
  std::cout << "Resulting VPack:" << std::endl;
  std::cout << HexDump(b->slice()) << std::endl;

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}